

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall
ImGuiTextFilter::ImGuiTextRange::split
          (ImGuiTextRange *this,char separator,ImVector<ImGuiTextFilter::ImGuiTextRange> *out)

{
  char *this_00;
  ImGuiTextRange local_50;
  ImGuiTextRange local_40;
  char *local_30;
  char *we;
  char *wb;
  ImVector<ImGuiTextFilter::ImGuiTextRange> *out_local;
  ImGuiTextRange *pIStack_10;
  char separator_local;
  ImGuiTextRange *this_local;
  
  wb = (char *)out;
  out_local._7_1_ = separator;
  pIStack_10 = this;
  ImVector<ImGuiTextFilter::ImGuiTextRange>::resize(out,0);
  local_30 = this->b;
  we = local_30;
  for (; this_00 = wb, local_30 < this->e; local_30 = local_30 + 1) {
    if (*local_30 == out_local._7_1_) {
      ImGuiTextRange(&local_40,we,local_30);
      ImVector<ImGuiTextFilter::ImGuiTextRange>::push_back
                ((ImVector<ImGuiTextFilter::ImGuiTextRange> *)this_00,&local_40);
      we = local_30 + 1;
    }
  }
  if (we != local_30) {
    ImGuiTextRange(&local_50,we,local_30);
    ImVector<ImGuiTextFilter::ImGuiTextRange>::push_back
              ((ImVector<ImGuiTextFilter::ImGuiTextRange> *)this_00,&local_50);
  }
  return;
}

Assistant:

void ImGuiTextFilter::ImGuiTextRange::split(char separator, ImVector<ImGuiTextRange>* out) const
{
    out->resize(0);
    const char* wb = b;
    const char* we = wb;
    while (we < e)
    {
        if (*we == separator)
        {
            out->push_back(ImGuiTextRange(wb, we));
            wb = we + 1;
        }
        we++;
    }
    if (wb != we)
        out->push_back(ImGuiTextRange(wb, we));
}